

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O1

void __thiscall BitmapIndexBuilder::save(BitmapIndexBuilder *this,string *fname)

{
  long lVar1;
  void *__s;
  uint64_t uVar2;
  long lVar3;
  value_type_conflict2 *__val;
  uint32_t reserved;
  uint32_t ndx_type;
  uint32_t version;
  uint32_t magic;
  ofstream out;
  undefined1 auStack_268 [4];
  undefined4 local_264;
  IndexType local_260 [2];
  BitmapIndexBuilder *local_258;
  undefined4 local_24c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  long local_230;
  filebuf local_228 [20];
  undefined4 auStack_214 [55];
  ios_base local_138 [264];
  
  local_258 = this;
  std::ofstream::ofstream(&local_230);
  lVar1 = *(long *)(local_230 + -0x18);
  *(undefined4 *)((long)auStack_214 + lVar1) = 1;
  std::ios::clear((int)auStack_268 + (int)lVar1 + 0x38);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)fname);
  local_24c = 0xca7da7a;
  local_260[1] = 6;
  local_260[0] = (local_258->super_IndexBuilder).ntype;
  local_264 = 0;
  std::ostream::write((char *)&local_230,(long)&local_24c);
  std::ostream::write((char *)&local_230,(long)(local_260 + 1));
  std::ostream::write((char *)&local_230,(long)local_260);
  std::ostream::write((char *)&local_230,(long)&local_264);
  lVar1 = std::ostream::tellp();
  __s = operator_new(0x8000008);
  lVar3 = 0;
  memset(__s,0,0x8000008);
  do {
    *(long *)((long)__s + lVar3 * 8) = lVar1;
    get_run(&local_248,local_258,(TriGram)lVar3);
    uVar2 = compress_run(&local_248,(ostream *)&local_230);
    if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar1 = lVar1 + uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1000000);
  *(long *)((long)__s + 0x8000000) = lVar1;
  std::ostream::write((char *)&local_230,(long)__s);
  operator_delete(__s,0x8000008);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _seekpos;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void BitmapIndexBuilder::save(const std::string &fname) {
    std::ofstream out;
    out.exceptions(std::ofstream::badbit);
    out.open(fname, std::ofstream::binary);

    uint32_t magic = DB_MAGIC;
    uint32_t version = 6;
    auto ndx_type = static_cast<uint32_t>(index_type());
    uint32_t reserved = 0;

    out.write(reinterpret_cast<char *>(&magic), 4);
    out.write(reinterpret_cast<char *>(&version), 4);
    out.write(reinterpret_cast<char *>(&ndx_type), 4);
    out.write(reinterpret_cast<char *>(&reserved), 4);

    auto offset = static_cast<uint64_t>(out.tellp());
    std::vector<uint64_t> offsets(NUM_TRIGRAMS + 1);

    for (TriGram i = 0; i < NUM_TRIGRAMS; i++) {
        offsets[i] = offset;
        offset += compress_run(get_run(i), out);
    }

    offsets[NUM_TRIGRAMS] = offset;

    out.write(reinterpret_cast<char *>(offsets.data()),
              (NUM_TRIGRAMS + 1) * sizeof(uint64_t));
}